

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O1

FieldDescriptor *
google::protobuf::(anonymous_namespace)::
GetExtension<google::protobuf::internal::ExtensionIdentifier<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>>
          (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
           *ext,Descriptor *descriptor)

{
  FieldDescriptor *pFVar1;
  
  pFVar1 = DescriptorPool::FindExtensionByNumber(descriptor->file_->pool_,descriptor,ext->number_);
  if (pFVar1 != (FieldDescriptor *)0x0) {
    return pFVar1;
  }
  GetExtension<google::protobuf::internal::ExtensionIdentifier<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>>
            ();
}

Assistant:

const FieldDescriptor* GetExtension(
    const ExtensionT& ext,
    const Descriptor* descriptor = FeatureSet::descriptor()) {
  return ABSL_DIE_IF_NULL(descriptor->file()->pool()->FindExtensionByNumber(
      descriptor, ext.number()));
}